

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void process(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  double noise_level;
  Error EVar4;
  int local_db0;
  allocator local_da9;
  int i;
  allocator local_d81;
  string local_d80 [32];
  double local_d60;
  Error er;
  duration<long,_std::ratio<1L,_1000L>_> local_d48;
  rep local_d40;
  rep duration;
  time_point end;
  time_point beg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8 [39];
  allocator local_cc1;
  string local_cc0 [39];
  allocator local_c99;
  string local_c98 [32];
  undefined1 local_c78 [8];
  ParameterSet param_denoiser;
  DataManager data;
  string local_2b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [32];
  undefined1 local_270 [8];
  ofstream output;
  string local_70 [55];
  allocator local_39;
  string local_38 [8];
  string model_name;
  char **argv_local;
  int argc_local;
  
  pcVar1 = argv[2];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_70,(ulong)local_38);
  std::__cxx11::string::operator=(local_38,local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2b0,".out",
             (allocator *)
             ((long)&data.mesh_.super_Mesh.
                     super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                     .
                     super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     .refcount_ftextureIndex_ + 3));
  std::operator+(local_290,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::ofstream::ofstream(local_270,(string *)local_290,_S_app);
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&data.mesh_.super_Mesh.
                     super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                     .
                     super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     .refcount_ftextureIndex_ + 3));
  DataManager::DataManager
            ((DataManager *)
             &param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ParameterSet::ParameterSet((ParameterSet *)local_c78);
  pcVar1 = argv[2];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c98,pcVar1,&local_c99);
  DataManager::ImportMeshFromFile
            ((DataManager *)
             &param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)local_c98);
  std::__cxx11::string::~string(local_c98);
  std::allocator<char>::~allocator((allocator<char> *)&local_c99);
  pcVar1 = argv[3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cc0,pcVar1,&local_cc1);
  noise_level = std::__cxx11::stod((string *)local_cc0,(size_t *)0x0);
  addNoise((DataManager *)&param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header._M_node_count
           ,noise_level);
  std::__cxx11::string::~string(local_cc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&beg,
                 (char *)local_38);
  std::operator+(local_d08,(char *)&beg);
  std::operator+(local_ce8,(char *)local_d08);
  DataManager::ExportMeshToFile
            ((DataManager *)
             &param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header._M_node_count,local_ce8);
  std::__cxx11::string::~string((string *)local_ce8);
  std::__cxx11::string::~string((string *)local_d08);
  std::__cxx11::string::~string((string *)&beg);
  end.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  denoise((DataManager *)&param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header._M_node_count,
          argc,argv);
  duration = std::chrono::_V2::system_clock::now();
  er.second = (double)std::chrono::operator-
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&duration,&end);
  local_d48.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&er.second);
  local_d40 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_d48);
  EVar4 = estimateMSAE((DataManager *)
                       &param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header._M_node_count);
  er.first = EVar4.second;
  local_d60 = EVar4.first;
  pcVar1 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d80,pcVar1,&local_d81);
  iVar2 = std::__cxx11::stoi((string *)local_d80,(size_t *)0x0,10);
  std::__cxx11::string::~string(local_d80);
  std::allocator<char>::~allocator((allocator<char> *)&local_d81);
  if (iVar2 == 1) {
    std::operator<<((ostream *)local_270,"Bilateral: ");
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i,pcVar1,&local_da9);
    iVar2 = std::__cxx11::stoi((string *)&i,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)&local_da9);
    if (iVar2 == 2) {
      std::operator<<((ostream *)local_270," Fast&Effective: ");
    }
  }
  for (local_db0 = 3; local_db0 < argc; local_db0 = local_db0 + 1) {
    poVar3 = std::operator<<((ostream *)local_270,argv[local_db0]);
    std::operator<<(poVar3," ");
  }
  poVar3 = std::operator<<((ostream *)local_270,"noisy:");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d60);
  poVar3 = std::operator<<(poVar3," denoised:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  ParameterSet::~ParameterSet((ParameterSet *)local_c78);
  DataManager::~DataManager
            ((DataManager *)
             &param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::ofstream::~ofstream(local_270);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void process(int argc, char *argv[])
{
    auto model_name = string(argv[2]);
    model_name = model_name.substr(0, model_name.length() - 4);
    std::ofstream output(model_name + string(".out"), std::ios::app);
    DataManager data;
    ParameterSet param_denoiser;
    // Add noise to model and export it
    data.ImportMeshFromFile(argv[2]);
    addNoise(&data, std::stod(argv[3]));
    data.ExportMeshToFile(model_name + "(noisy " + argv[3]  + ").obj");
    // Denoise the model then measure the error and the duration
    auto beg = std::chrono::high_resolution_clock::now();
    denoise(&data, argc, argv);
    auto end = std::chrono::high_resolution_clock::now();

    auto duration = std::chrono::duration_cast<std::chrono::milliseconds>(end - beg).count();
    auto er = estimateMSAE(data);
    // export the denoised model.
    if(std::stoi(argv[1]) == 1)
        output << "Bilateral: ";
    else if(std::stoi(argv[1]) == 2)
        output << " Fast&Effective: ";

    for(int i = 3; i < argc; ++i)
        output << argv[i] << " ";
    output << "noisy:" << er.first << " denoised:" << std::endl;
    output.close();
}